

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * lua_pushfstring(lua_State *L,char *fmt,...)

{
  char *pcVar1;
  long in_RDI;
  __va_list_tag *unaff_retaddr;
  char *in_stack_00000008;
  lua_State *in_stack_00000010;
  va_list argp;
  char *ret;
  lua_State *in_stack_ffffffffffffff20;
  
  if (*(ulong *)(*(long *)(in_RDI + 0x20) + 0x70) <= *(ulong *)(*(long *)(in_RDI + 0x20) + 0x78)) {
    luaC_step(in_stack_ffffffffffffff20);
  }
  pcVar1 = luaO_pushvfstring(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return pcVar1;
}

Assistant:

static const char*lua_pushfstring(lua_State*L,const char*fmt,...){
const char*ret;
va_list argp;
luaC_checkGC(L);
va_start(argp,fmt);
ret=luaO_pushvfstring(L,fmt,argp);
va_end(argp);
return ret;
}